

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::InitializeUI(cmCursesMainForm *this)

{
  bool bVar1;
  CacheEntryType CVar2;
  vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>> *this_00;
  cmCursesCacheEntryComposite *pcVar3;
  cmCursesWidget *this_01;
  int iVar4;
  string *key_00;
  pointer pbVar5;
  _Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
  *this_02;
  cmCursesCacheEntryComposite *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string key;
  cmCursesCacheEntryComposite *comp;
  
  this_00 = (vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>> *)
            operator_new(0x18);
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  cmState::GetCacheEntryKeys_abi_cxx11_(&cacheKeys,this->CMakeInstance->State);
  std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
  reserve((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)
          this_00,(long)cacheKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)cacheKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
  iVar4 = 0;
  for (key_00 = cacheKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      key_00 != cacheKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; key_00 = key_00 + 1) {
    CVar2 = cmState::GetCacheEntryType(this->CMakeInstance->State,key_00);
    iVar4 = iVar4 + (uint)(CVar2 + ~UNINITIALIZED < 0xfffffffd);
  }
  if (iVar4 == 0) {
    pcVar3 = (cmCursesCacheEntryComposite *)operator_new(0x40);
    std::__cxx11::string::string((string *)&key,"EMPTY CACHE",(allocator *)&local_78);
    cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(pcVar3,&key,0x1e,0x1e);
    comp = pcVar3;
    std::__cxx11::string::~string((string *)&key);
    this_01 = (cmCursesWidget *)operator_new(0x40);
    cmCursesDummyWidget::cmCursesDummyWidget((cmCursesDummyWidget *)this_01,1,1,1,1);
    pcVar3->Entry = this_01;
    std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
    push_back((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               *)this_00,&comp);
  }
  else {
    iVar4 = this->InitialWidth + -0x23;
    for (pbVar5 = cacheKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != key_00; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::string::string((string *)&key,(string *)pbVar5);
      CVar2 = cmState::GetCacheEntryType(this->CMakeInstance->State,pbVar5);
      if (2 < CVar2 - INTERNAL) {
        bVar1 = LookForCacheEntry(this,&key);
        if (!bVar1) {
          pcVar3 = (cmCursesCacheEntryComposite *)operator_new(0x40);
          cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
                    (pcVar3,&key,this->CMakeInstance,true,0x1e,iVar4);
          local_78 = pcVar3;
          std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>::
          emplace_back<cmCursesCacheEntryComposite*>(this_00,&local_78);
          this->OkToGenerate = false;
        }
      }
      std::__cxx11::string::~string((string *)&key);
      key_00 = cacheKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (pbVar5 = cacheKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != key_00; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::string::string((string *)&key,(string *)pbVar5);
      CVar2 = cmState::GetCacheEntryType(this->CMakeInstance->State,pbVar5);
      if (2 < CVar2 - INTERNAL) {
        bVar1 = LookForCacheEntry(this,&key);
        if (bVar1) {
          pcVar3 = (cmCursesCacheEntryComposite *)operator_new(0x40);
          cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
                    (pcVar3,&key,this->CMakeInstance,false,0x1e,iVar4);
          local_78 = pcVar3;
          std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>::
          emplace_back<cmCursesCacheEntryComposite*>(this_00,&local_78);
        }
      }
      std::__cxx11::string::~string((string *)&key);
      key_00 = cacheKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (this->Entries !=
      (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)0x0)
  {
    cmDeleteAll<std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>
              (this->Entries);
    this_02 = &this->Entries->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
    ;
    if (this_02 !=
        (_Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
         *)0x0) {
      std::
      _Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
      ~_Vector_base(this_02);
      goto LAB_0025ff87;
    }
  }
  this_02 = (_Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
             *)0x0;
LAB_0025ff87:
  operator_delete(this_02,0x18);
  this->Entries =
       (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)
       this_00;
  RePost(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cacheKeys);
  return;
}

Assistant:

void cmCursesMainForm::InitializeUI()
{
  // Create a vector of cmCursesCacheEntryComposite's
  // which contain labels, entries and new entry markers
  std::vector<cmCursesCacheEntryComposite*>* newEntries =
    new std::vector<cmCursesCacheEntryComposite*>;
  std::vector<std::string> cacheKeys =
      this->CMakeInstance->GetState()->GetCacheEntryKeys();
  newEntries->reserve(cacheKeys.size());

  // Count non-internal and non-static entries
  int count=0;

  for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
      it != cacheKeys.end(); ++it)
    {
    cmState::CacheEntryType t = this->CMakeInstance->GetState()
        ->GetCacheEntryType(*it);
    if (t != cmState::INTERNAL &&
        t != cmState::STATIC &&
        t != cmState::UNINITIALIZED)
      {
      ++count;
      }
    }

  int entrywidth = this->InitialWidth - 35;

  cmCursesCacheEntryComposite* comp;
  if ( count == 0 )
    {
    // If cache is empty, display a label saying so and a
    // dummy entry widget (does not respond to input)
    comp = new cmCursesCacheEntryComposite("EMPTY CACHE", 30, 30);
    comp->Entry = new cmCursesDummyWidget(1, 1, 1, 1);
    newEntries->push_back(comp);
    }
  else
    {
    // Create the composites.

    // First add entries which are new
    for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
        it != cacheKeys.end(); ++it)
      {
      std::string key = *it;
      cmState::CacheEntryType t = this->CMakeInstance->GetState()
          ->GetCacheEntryType(*it);
      if (t == cmState::INTERNAL ||
          t == cmState::STATIC ||
          t == cmState::UNINITIALIZED )
        {
        continue;
        }

      if (!this->LookForCacheEntry(key))
        {
        newEntries->push_back(new cmCursesCacheEntryComposite(key,
                                                          this->CMakeInstance,
                                                          true, 30,
                                                          entrywidth));
        this->OkToGenerate = false;
        }
      }

    // then add entries which are old
    for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
        it != cacheKeys.end(); ++it)
      {
      std::string key = *it;
      cmState::CacheEntryType t = this->CMakeInstance->GetState()
          ->GetCacheEntryType(*it);
      if (t == cmState::INTERNAL ||
          t == cmState::STATIC ||
          t == cmState::UNINITIALIZED )
        {
        continue;
        }

      if (this->LookForCacheEntry(key))
        {
        newEntries->push_back(new cmCursesCacheEntryComposite(key,
                                                          this->CMakeInstance,
                                                          false, 30,
                                                          entrywidth));
        }
      }
    }

  // Clean old entries
  if (this->Entries)
    {
    cmDeleteAll(*this->Entries);
    }
  delete this->Entries;
  this->Entries = newEntries;

  // Compute fields from composites
  this->RePost();
}